

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O0

void Gia_ManFindChains(Gia_Man_t *p,Vec_Int_t *vFadds,Vec_Int_t *vMap)

{
  int iVar1;
  Vec_Int_t *p_00;
  Vec_Int_t *vLength;
  int i;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vFadds_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_IntStartFull(iVar1);
  vLength._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(vFadds);
    if (iVar1 / 5 <= vLength._4_4_) break;
    iVar1 = Vec_IntEntry(vFadds,vLength._4_4_ * 5 + 4);
    Gia_ManFindChains_rec(p,iVar1,vFadds,vMap,p_00);
    vLength._4_4_ = vLength._4_4_ + 1;
  }
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Gia_ManFindChains( Gia_Man_t * p, Vec_Int_t * vFadds, Vec_Int_t * vMap )
{
    int i;
    // for each FADD find the longest chain rooted in it
    Vec_Int_t * vLength = Vec_IntStartFull( Gia_ManObjNum(p) );
    Dtc_ForEachFadd( vFadds, i )
        Gia_ManFindChains_rec( p, Vec_IntEntry(vFadds, 5*i+4), vFadds, vMap, vLength );
    Vec_IntFree( vLength );
}